

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureFilteringTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::texture::anon_unknown_0::Texture2DArrayFilteringTestInstance::iterate
          (TestStatus *__return_storage_ptr__,Texture2DArrayFilteringTestInstance *this)

{
  TextureRenderer *this_00;
  pointer pFVar1;
  ostringstream *poVar2;
  undefined8 uVar3;
  FilterMode FVar4;
  FilterMode FVar5;
  pointer pFVar6;
  TextureFormat TVar7;
  TestContext *pTVar8;
  bool bVar9;
  int iVar10;
  deUint32 dVar11;
  deUint32 dVar12;
  undefined4 extraout_EAX;
  uint uVar13;
  TestTexture2DArray *pTVar14;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  byte bVar15;
  long lVar16;
  float fVar17;
  float fVar18;
  undefined1 auVar19 [16];
  LodPrecision lodPrecision;
  PixelFormat pixelFormat;
  Texture2DArrayView local_378;
  IVec4 formatBitDepth;
  undefined1 local_348 [32];
  size_type sStack_328;
  BVec4 local_320;
  Surface rendered;
  TextureFormat texFmt;
  float local_2f8;
  float fStack_2f4;
  IVec4 colorBits;
  undefined1 local_2bc [76];
  size_type sStack_270;
  size_type local_268;
  int aiStack_260 [2];
  int local_258;
  anon_union_16_3_1194ccdc_for_v local_254;
  undefined8 local_244;
  LodMode local_23c;
  Vector<float,_3> local_228;
  float local_21c;
  float local_218;
  float local_214;
  float local_210;
  float local_20c;
  float local_208;
  undefined8 local_204;
  float local_1fc;
  undefined1 local_1f0 [32];
  int local_1d0;
  anon_union_16_3_1194ccdc_for_v local_1cc [21];
  TextureFormatInfo fmtInfo;
  
  pFVar6 = (this->m_cases).
           super__Vector_base<vkt::texture::(anonymous_namespace)::Texture2DArrayFilteringTestInstance::FilterCase,_std::allocator<vkt::texture::(anonymous_namespace)::Texture2DArrayFilteringTestInstance::FilterCase>_>
           ._M_impl.super__Vector_impl_data._M_start;
  TVar7 = (TextureFormat)((this->super_TestInstance).m_context)->m_testCtx->m_log;
  pFVar1 = pFVar6 + this->m_caseNdx;
  this_00 = &this->m_renderer;
  pTVar14 = util::TextureRenderer::get2DArrayTexture(this_00,pFVar6[this->m_caseNdx].textureIndex);
  iVar10 = (*(pTVar14->super_TestTexture)._vptr_TestTexture[0xe])(pTVar14);
  texFmt = *(TextureFormat *)CONCAT44(extraout_var,iVar10);
  tcu::getTextureFormatInfo(&fmtInfo,&texFmt);
  glu::TextureTestUtil::ReferenceParams::ReferenceParams
            ((ReferenceParams *)local_2bc,TEXTURETYPE_2D_ARRAY);
  dVar11 = util::TextureRenderer::getRenderWidth(this_00);
  dVar12 = util::TextureRenderer::getRenderHeight(this_00);
  tcu::Surface::Surface(&rendered,dVar11,dVar12);
  lVar16 = 0;
  do {
    tcu::Vector<float,_3>::Vector((Vector<float,_3> *)((long)local_228.m_data + lVar16));
    lVar16 = lVar16 + 0xc;
  } while (lVar16 != 0x30);
  util::createSampler((Sampler *)local_1f0,
                      (this->m_testParameters).super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.wrapS,
                      (this->m_testParameters).super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.wrapT,
                      (this->m_testParameters).super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.minFilter,
                      (this->m_testParameters).super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.magFilter);
  local_258 = local_1d0;
  local_268 = local_1f0._16_8_;
  aiStack_260[0] = local_1f0._24_4_;
  aiStack_260[1] = local_1f0._28_4_;
  local_2bc._68_8_ = local_1f0._0_8_;
  sStack_270 = local_1f0._8_8_;
  local_254._0_8_ = local_1cc[0]._0_8_;
  local_254._8_8_ = local_1cc[0]._8_8_;
  local_244 = local_1cc[1]._0_8_;
  local_2bc._4_4_ = glu::TextureTestUtil::getSamplerType(texFmt);
  local_23c = LODMODE_EXACT;
  local_2bc._52_4_ = fmtInfo.lookupBias.m_data[0];
  local_2bc._56_4_ = fmtInfo.lookupBias.m_data[1];
  local_2bc._60_4_ = fmtInfo.lookupBias.m_data[2];
  local_2bc._64_4_ = fmtInfo.lookupBias.m_data[3];
  local_2bc._36_4_ = fmtInfo.lookupScale.m_data[0];
  local_2bc._40_4_ = fmtInfo.lookupScale.m_data[1];
  local_2bc._44_4_ = fmtInfo.lookupScale.m_data[2];
  local_2bc._48_4_ = fmtInfo.lookupScale.m_data[3];
  poVar2 = (ostringstream *)(local_1f0 + 8);
  local_1f0._0_8_ = TVar7;
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::operator<<((ostream *)poVar2,"Approximate lod per axis = ");
  tcu::operator<<((ostream *)poVar2,&pFVar1->lod);
  std::operator<<((ostream *)poVar2,", offset = ");
  tcu::operator<<((ostream *)poVar2,&pFVar1->offset);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1f0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  fVar18 = (pFVar1->lod).m_data[1];
  uVar3 = *(undefined8 *)(pFVar1->offset).m_data;
  fVar17 = deFloatExp2((pFVar1->lod).m_data[0]);
  dVar11 = util::TextureRenderer::getRenderWidth(this_00);
  lVar16 = (**(code **)((long)(((this->m_textures).
                                super__Vector_base<de::SharedPtr<vkt::pipeline::TestTexture2DArray>,_std::allocator<de::SharedPtr<vkt::pipeline::TestTexture2DArray>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->m_ptr->super_TestTexture
                              )._vptr_TestTexture + 0x88))();
  iVar10 = *(int *)(lVar16 + 0x38);
  fVar18 = deFloatExp2(fVar18);
  dVar12 = util::TextureRenderer::getRenderHeight(this_00);
  lVar16 = (**(code **)((long)(((this->m_textures).
                                super__Vector_base<de::SharedPtr<vkt::pipeline::TestTexture2DArray>,_std::allocator<de::SharedPtr<vkt::pipeline::TestTexture2DArray>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->m_ptr->super_TestTexture
                              )._vptr_TestTexture + 0x88))();
  local_228.m_data[2] = (pFVar1->layerRange).m_data[0];
  local_1fc = (pFVar1->layerRange).m_data[1];
  local_2f8 = (float)uVar3;
  fStack_2f4 = (float)((ulong)uVar3 >> 0x20);
  local_228.m_data[0] = local_2f8;
  local_228.m_data[1] = fStack_2f4;
  local_214 = local_228.m_data[2] * 0.5 + local_1fc * 0.5;
  local_21c = local_2f8;
  local_20c = fStack_2f4;
  local_210 = (fVar17 * (float)dVar11) / (float)iVar10 + local_2f8;
  local_218 = (fVar18 * (float)dVar12) / (float)*(int *)(lVar16 + 0x3c) + fStack_2f4;
  local_204 = CONCAT44(local_218,local_210);
  local_208 = local_214;
  util::TextureRenderer::renderQuad
            (this_00,&rendered,pFVar1->textureIndex,local_228.m_data,(ReferenceParams *)local_2bc);
  FVar4 = (this->m_testParameters).super_Texture2DTestCaseParameters.
          super_TextureCommonTestCaseParameters.magFilter;
  FVar5 = (this->m_testParameters).super_Texture2DTestCaseParameters.
          super_TextureCommonTestCaseParameters.minFilter;
  local_1f0._0_8_ = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  tcu::getTextureFormatBitDepth((tcu *)&formatBitDepth,(TextureFormat *)local_1f0);
  pixelFormat.redBits = formatBitDepth.m_data[0];
  pixelFormat.greenBits = formatBitDepth.m_data[1];
  pixelFormat.blueBits = formatBitDepth.m_data[2];
  pixelFormat.alphaBits = formatBitDepth.m_data[3];
  local_348._8_4_ = formatBitDepth.m_data[2];
  local_348._12_4_ = formatBitDepth.m_data[3];
  tcu::operator-((tcu *)local_1f0,(Vector<int,_4> *)local_348,
                 (FVar4 != NEAREST || FVar5 != NEAREST) + 1);
  tcu::Vector<int,_4>::Vector((Vector<int,_4> *)&local_378,0);
  tcu::max<int,4>((tcu *)&colorBits,(Vector<int,_4> *)local_1f0,(Vector<int,_4> *)&local_378);
  lodPrecision.rule = RULE_VULKAN;
  lodPrecision.derivateBits = 0x16;
  lodPrecision.lodBits = 0x10;
  tcu::LookupPrecision::LookupPrecision((LookupPrecision *)local_348);
  lodPrecision.derivateBits = 0x12;
  lodPrecision.lodBits = 6;
  tcu::computeFixedPointThreshold((tcu *)&local_378,&colorBits);
  tcu::operator/((tcu *)local_1f0,(Vector<float,_4> *)&local_378,
                 (Vector<float,_4> *)(local_2bc + 0x24));
  local_348._24_8_ = local_1f0._0_8_;
  sStack_328 = local_1f0._8_8_;
  local_348._0_4_ = 0x14;
  local_348._4_4_ = 0x14;
  local_348._8_4_ = 0x14;
  local_348._12_4_ = 7;
  local_348._16_4_ = 7;
  local_348._20_4_ = 0;
  auVar19._0_4_ = -(uint)(0 < pixelFormat.redBits);
  auVar19._4_4_ = -(uint)(0 < pixelFormat.greenBits);
  auVar19._8_4_ = -(uint)(0 < pixelFormat.blueBits);
  auVar19._12_4_ = -(uint)(0 < pixelFormat.alphaBits);
  uVar13 = movmskps(extraout_EAX,auVar19);
  bVar15 = (byte)uVar13;
  local_320.m_data =
       (bool  [4])
       (uVar13 & 1 | (uint)((bVar15 & 2) >> 1) << 8 | (uint)((bVar15 & 4) >> 2) << 0x10 |
       (uint)(bVar15 >> 3) << 0x18);
  pTVar8 = ((this->super_TestInstance).m_context)->m_testCtx;
  tcu::Surface::getAccess((PixelBufferAccess *)local_1f0,&rendered);
  iVar10 = (*(pTVar14->super_TestTexture)._vptr_TestTexture[0x10])(pTVar14);
  local_378.m_numLevels = *(int *)(CONCAT44(extraout_var_00,iVar10) + 0x48);
  local_378.m_levels = *(ConstPixelBufferAccess **)(CONCAT44(extraout_var_00,iVar10) + 0x50);
  bVar9 = glu::TextureTestUtil::verifyTextureResult
                    (pTVar8,(ConstPixelBufferAccess *)local_1f0,&local_378,local_228.m_data,
                     (ReferenceParams *)local_2bc,(LookupPrecision *)local_348,&lodPrecision,
                     &pixelFormat);
  if (bVar9) {
LAB_00778ec6:
    iVar10 = this->m_caseNdx + 1;
    this->m_caseNdx = iVar10;
    if (iVar10 < (int)(((long)(this->m_cases).
                              super__Vector_base<vkt::texture::(anonymous_namespace)::Texture2DArrayFilteringTestInstance::FilterCase,_std::allocator<vkt::texture::(anonymous_namespace)::Texture2DArrayFilteringTestInstance::FilterCase>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->m_cases).
                             super__Vector_base<vkt::texture::(anonymous_namespace)::Texture2DArrayFilteringTestInstance::FilterCase,_std::allocator<vkt::texture::(anonymous_namespace)::Texture2DArrayFilteringTestInstance::FilterCase>_>
                             ._M_impl.super__Vector_impl_data._M_start) / 0x1c)) {
      tcu::TestStatus::incomplete();
      goto LAB_00778f9f;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1f0,"Pass",(allocator<char> *)local_348);
    tcu::TestStatus::pass(__return_storage_ptr__,(string *)local_1f0);
  }
  else {
    local_348._12_4_ = 4;
    local_348._16_4_ = 4;
    local_348._20_4_ = 0;
    lodPrecision.lodBits = 4;
    poVar2 = (ostringstream *)(local_1f0 + 8);
    local_1f0._0_8_ = TVar7;
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::operator<<((ostream *)poVar2,
                    "Warning: Verification against high precision requirements failed, trying with lower requirements."
                   );
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1f0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar2);
    pTVar8 = ((this->super_TestInstance).m_context)->m_testCtx;
    tcu::Surface::getAccess((PixelBufferAccess *)local_1f0,&rendered);
    iVar10 = (*(pTVar14->super_TestTexture)._vptr_TestTexture[0x10])(pTVar14);
    local_378.m_numLevels = *(int *)(CONCAT44(extraout_var_01,iVar10) + 0x48);
    local_378.m_levels = *(ConstPixelBufferAccess **)(CONCAT44(extraout_var_01,iVar10) + 0x50);
    bVar9 = glu::TextureTestUtil::verifyTextureResult
                      (pTVar8,(ConstPixelBufferAccess *)local_1f0,&local_378,local_228.m_data,
                       (ReferenceParams *)local_2bc,(LookupPrecision *)local_348,&lodPrecision,
                       &pixelFormat);
    if (bVar9) goto LAB_00778ec6;
    poVar2 = (ostringstream *)(local_1f0 + 8);
    local_1f0._0_8_ = TVar7;
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::operator<<((ostream *)poVar2,
                    "ERROR: Verification against low precision requirements failed, failing test case."
                   );
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1f0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar2);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1f0,"Image verification failed",(allocator<char> *)&local_378);
    tcu::TestStatus::fail(__return_storage_ptr__,(string *)local_1f0);
  }
  std::__cxx11::string::~string((string *)local_1f0);
LAB_00778f9f:
  tcu::Surface::~Surface(&rendered);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus Texture2DArrayFilteringTestInstance::iterate (void)
{
	tcu::TestLog&						log			= m_context.getTestContext().getLog();

	const FilterCase&					curCase		= m_cases[m_caseNdx];
	const pipeline::TestTexture2DArray&	texture		= m_renderer.get2DArrayTexture(curCase.textureIndex);
	const tcu::TextureFormat			texFmt		= texture.getTextureFormat();
	const tcu::TextureFormatInfo		fmtInfo		= tcu::getTextureFormatInfo(texFmt);
	ReferenceParams						refParams	(TEXTURETYPE_2D_ARRAY);
	tcu::Surface						rendered	(m_renderer.getRenderWidth(), m_renderer.getRenderHeight());
	tcu::Vec3							texCoord[4];
	const float* const					texCoordPtr	= (const float*)&texCoord[0];

	// Params for reference computation.

	refParams.sampler		= util::createSampler(m_testParameters.wrapS, m_testParameters.wrapT, m_testParameters.minFilter, m_testParameters.magFilter);
	refParams.samplerType	= getSamplerType(texFmt);
	refParams.lodMode		= LODMODE_EXACT;
	refParams.colorBias		= fmtInfo.lookupBias;
	refParams.colorScale	= fmtInfo.lookupScale;

	// Compute texture coordinates.
	log << TestLog::Message << "Approximate lod per axis = " << curCase.lod << ", offset = " << curCase.offset << TestLog::EndMessage;

	{
		const float	lodX	= curCase.lod.x();
		const float	lodY	= curCase.lod.y();
		const float	oX		= curCase.offset.x();
		const float	oY		= curCase.offset.y();
		const float	sX		= deFloatExp2(lodX) * float(m_renderer.getRenderWidth()) / float(m_textures[0]->getTexture().getWidth());
		const float	sY		= deFloatExp2(lodY) * float(m_renderer.getRenderHeight()) / float(m_textures[0]->getTexture().getHeight());
		const float	l0		= curCase.layerRange.x();
		const float	l1		= curCase.layerRange.y();

		texCoord[0] = tcu::Vec3(oX,		oY,		l0);
		texCoord[1] = tcu::Vec3(oX,		oY+sY,	l0*0.5f + l1*0.5f);
		texCoord[2] = tcu::Vec3(oX+sX,	oY,		l0*0.5f + l1*0.5f);
		texCoord[3] = tcu::Vec3(oX+sX,	oY+sY,	l1);
	}

	m_renderer.renderQuad(rendered, curCase.textureIndex, texCoordPtr, refParams);

	{

		const bool				isNearestOnly	= m_testParameters.minFilter == Sampler::NEAREST && m_testParameters.magFilter == Sampler::NEAREST;
		const tcu::IVec4		formatBitDepth	= getTextureFormatBitDepth(vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM));
		const tcu::PixelFormat	pixelFormat		(formatBitDepth[0], formatBitDepth[1], formatBitDepth[2], formatBitDepth[3]);
		const tcu::IVec4		colorBits		= max(getBitsVec(pixelFormat) - (isNearestOnly ? 1 : 2), tcu::IVec4(0)); // 1 inaccurate bit if nearest only, 2 otherwise
		tcu::LodPrecision		lodPrecision	(tcu::LodPrecision::RULE_VULKAN);
		tcu::LookupPrecision	lookupPrecision;

		lodPrecision.derivateBits		= 18;
		lodPrecision.lodBits			= 6;
		lookupPrecision.colorThreshold	= tcu::computeFixedPointThreshold(colorBits) / refParams.colorScale;
		lookupPrecision.coordBits		= tcu::IVec3(20,20,20);
		lookupPrecision.uvwBits			= tcu::IVec3(7,7,0);
		lookupPrecision.colorMask		= getCompareMask(pixelFormat);

		const bool isHighQuality = verifyTextureResult(m_context.getTestContext(), rendered.getAccess(), (tcu::Texture2DArrayView)texture.getTexture(),
													   texCoordPtr, refParams, lookupPrecision, lodPrecision, pixelFormat);

		if (!isHighQuality)
		{
			// Evaluate against lower precision requirements.
			lodPrecision.lodBits	= 4;
			lookupPrecision.uvwBits	= tcu::IVec3(4,4,0);

			log << TestLog::Message << "Warning: Verification against high precision requirements failed, trying with lower requirements." << TestLog::EndMessage;

			const bool isOk = verifyTextureResult(m_context.getTestContext(), rendered.getAccess(), (tcu::Texture2DArrayView)texture.getTexture(),
												  texCoordPtr, refParams, lookupPrecision, lodPrecision, pixelFormat);

			if (!isOk)
			{
				log << TestLog::Message << "ERROR: Verification against low precision requirements failed, failing test case." << TestLog::EndMessage;
				return tcu::TestStatus::fail("Image verification failed");
			}
		}
	}

	m_caseNdx += 1;
	return m_caseNdx < (int)m_cases.size() ? tcu::TestStatus::incomplete() : tcu::TestStatus::pass("Pass");
}